

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper.c
# Opt level: O2

int Map_CommandReadLibrary(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *FileName;
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  void *pvVar2;
  Mio_Library_t *pGenlib;
  Map_SuperLib_t *pLib;
  Map_SuperLib_t *p;
  char *pcVar3;
  uint fAlgorithm;
  size_t sStack_40;
  uint local_34;
  
  Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  pcVar3 = (char *)0x0;
  Extra_UtilGetoptReset();
  fAlgorithm = 1;
  local_34 = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"eovh"), iVar1 == 0x6f) {
      fAlgorithm = fAlgorithm ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x76) {
      local_34 = local_34 ^ 1;
    }
    else {
      if ((iVar1 != 0x65) || (pcVar3 = argv[globalUtilOptind], pcVar3 == (char *)0x0)) {
LAB_00362fcb:
        fwrite("\nusage: read_super [-ovh]\n",0x1a,1,__stream);
        fwrite("\t         read the supergate library from the file\n",0x33,1,__stream);
        fwrite("\t-e file : file contains list of genlib gates to exclude\n",0x39,1,__stream);
        pcVar3 = "Sort new";
        if (fAlgorithm == 0) {
          pcVar3 = "Sort old";
        }
        fprintf(__stream,"\t-o      : toggles the use of old file format [default = %s]\n",
                pcVar3 + 5);
        pcVar3 = "yes";
        if (local_34 == 0) {
          pcVar3 = "no";
        }
        fprintf(__stream,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar3);
        pcVar3 = "\t-h      : print the command usage\n";
        sStack_40 = 0x23;
LAB_00363069:
        fwrite(pcVar3,sStack_40,1,__stream);
        return 1;
      }
      globalUtilOptind = globalUtilOptind + 1;
    }
  }
  if (globalUtilOptind + 1 == argc) {
    FileName = argv[globalUtilOptind];
    __stream_00 = (FILE *)Io_FileOpen(FileName,"open_path","r",0);
    if (__stream_00 == (FILE *)0x0) {
      fprintf(__stream,"Cannot open input file \"%s\". ",FileName);
      pcVar3 = Extra_FileGetSimilarName(FileName,".genlib",".lib",".gen",".g",(char *)0x0);
      if (pcVar3 != (char *)0x0) {
        fprintf(__stream,"Did you mean \"%s\"?",pcVar3);
      }
      fputc(10,__stream);
      return 1;
    }
    fclose(__stream_00);
    pvVar2 = Abc_FrameReadLibGen();
    if (pvVar2 == (void *)0x0) {
      pcVar3 = "Genlib library should be read in first..\n";
      sStack_40 = 0x29;
    }
    else {
      pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pLib = Map_SuperLibCreate(pGenlib,(Vec_Str_t *)0x0,FileName,pcVar3,fAlgorithm,local_34);
      if (pLib != (Map_SuperLib_t *)0x0) {
        p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
        Map_SuperLibFree(p);
        Abc_FrameSetLibSuper(pLib);
        return 0;
      }
      pcVar3 = "Reading supergate library has failed.\n";
      sStack_40 = 0x26;
    }
    goto LAB_00363069;
  }
  goto LAB_00362fcb;
}

Assistant:

int Map_CommandReadLibrary( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Map_SuperLib_t * pLib;
    Abc_Ntk_t * pNet;
    char * FileName, * ExcludeFile;
    int fVerbose;
    int fAlgorithm;
    int c;

    pNet = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    fVerbose = 1;
    fAlgorithm = 1;
    ExcludeFile = 0;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "eovh")) != EOF ) 
    {
        switch (c) 
        {
            case 'e':
                ExcludeFile = argv[globalUtilOptind];
                if ( ExcludeFile == 0 )
                    goto usage;
                globalUtilOptind++;
                break;
            case 'o':
                fAlgorithm ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }


    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( FileName, "open_path", "r", 0 )) == NULL )
//    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", FileName );
        if (( FileName = Extra_FileGetSimilarName( FileName, ".genlib", ".lib", ".gen", ".g", NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", FileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    if ( Abc_FrameReadLibGen() == NULL )
    {
        fprintf( pErr, "Genlib library should be read in first..\n" );
        return 1;
    }

    // set the new network
    pLib = Map_SuperLibCreate( (Mio_Library_t *)Abc_FrameReadLibGen(), NULL, FileName, ExcludeFile, fAlgorithm, fVerbose );
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading supergate library has failed.\n" );
        return 1;
    }
    // replace the current library
//    Map_SuperLibFree( s_pSuperLib );
//    s_pSuperLib = pLib;
    Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
    Abc_FrameSetLibSuper( pLib );
    // replace the current genlib library
//    Mio_LibraryDelete( (Mio_Library_t *)Abc_FrameReadLibGen() );
//    Abc_FrameSetLibGen( (Mio_Library_t *)pLib->pGenlib );
    return 0;

usage:
    fprintf( pErr, "\nusage: read_super [-ovh]\n");
    fprintf( pErr, "\t         read the supergate library from the file\n" );  
    fprintf( pErr, "\t-e file : file contains list of genlib gates to exclude\n" );
    fprintf( pErr, "\t-o      : toggles the use of old file format [default = %s]\n", (fAlgorithm? "new" : "old") );
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       /* error exit */
}